

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboColorMultiTex2DCase::render(FboColorMultiTex2DCase *this,Surface *dst)

{
  deUint32 dVar1;
  DataType DVar2;
  int iVar3;
  int iVar4;
  DataTypes *pDVar5;
  Context *pCVar6;
  void *data_00;
  ContextWrapper *this_00;
  deUint32 local_90c;
  IVec2 *local_8d0;
  deUint32 *local_8b0;
  deUint32 *local_8a8;
  IVec2 *local_8a0;
  deUint32 local_894;
  TextureFormat *local_888;
  Vector<float,_3> local_7e8;
  Vector<float,_3> local_7dc;
  Vector<float,_3> local_7d0;
  Vector<float,_3> local_7c4;
  PixelBufferAccess local_7b8;
  Vector<float,_4> local_790;
  Vector<float,_4> local_780;
  PixelBufferAccess local_770;
  Vector<float,_4> local_748;
  Vector<float,_4> local_738;
  PixelBufferAccess local_728;
  TextureFormat local_700;
  undefined1 local_6f8 [8];
  TextureLevel data;
  IVec2 *viewport;
  deUint32 local_6c0;
  deUint32 fbo_1;
  deUint32 tmpTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format_1;
  int ndx_1;
  deUint32 *tex;
  deUint32 *fbo;
  IVec2 *size;
  bool isFilterable;
  TextureFormat TStack_688;
  deUint32 format;
  TransferFormat local_680;
  TransferFormat transferFmt;
  int ndx;
  deUint32 tex1;
  deUint32 tex0;
  deUint32 fbo1;
  deUint32 fbo0;
  Vec4 local_654;
  Vec4 local_644;
  Vec4 local_634;
  deUint32 local_624;
  deUint32 local_620;
  deUint32 multiTexShaderID;
  deUint32 texToFbo1ShaderID;
  deUint32 texToFbo0ShaderID;
  Vector<float,_4> local_608;
  float local_5f8 [2];
  TextureFormat local_5f0;
  DataTypes local_5e8;
  undefined1 local_5d0 [8];
  Texture2DShader multiTexShader;
  DataTypes local_428;
  undefined1 local_410 [8];
  Texture2DShader texToFbo1Shader;
  DataTypes local_258;
  undefined1 local_240 [8];
  Texture2DShader texToFbo0Shader;
  TextureFormatInfo fmtInfo1;
  TextureFormatInfo fmtInfo0;
  TextureFormat texFmt1;
  TextureFormat texFmt0;
  Surface *dst_local;
  FboColorMultiTex2DCase *this_local;
  
  texFmt1 = glu::mapGLInternalFormat(*(deUint32 *)&(this->super_FboColorbufferCase).field_0x8c);
  fmtInfo0.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_tex1Fmt);
  tcu::getTextureFormatInfo((TextureFormatInfo *)(fmtInfo1.lookupBias.m_data + 2),&texFmt1);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&texToFbo0Shader.m_outputType,
             (TextureFormat *)(fmtInfo0.lookupBias.m_data + 2));
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_258);
  pDVar5 = FboTestUtil::DataTypes::operator<<(&local_258,TYPE_SAMPLER_2D);
  DVar2 = FboTestUtil::getFragmentOutputType(&texFmt1);
  tcu::operator-((tcu *)&texToFbo1Shader.field_0x194,
                 (Vector<float,_4> *)(fmtInfo0.valueMin.m_data + 2),
                 (Vector<float,_4> *)(fmtInfo1.lookupBias.m_data + 2));
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_240,pDVar5,DVar2,(Vec4 *)&texToFbo1Shader.field_0x194,
             (Vec4 *)(fmtInfo1.lookupBias.m_data + 2));
  FboTestUtil::DataTypes::~DataTypes(&local_258);
  local_428.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_428);
  pDVar5 = FboTestUtil::DataTypes::operator<<(&local_428,TYPE_SAMPLER_2D);
  DVar2 = FboTestUtil::getFragmentOutputType((TextureFormat *)(fmtInfo0.lookupBias.m_data + 2));
  tcu::operator-((tcu *)&multiTexShader.m_outputType,
                 (Vector<float,_4> *)(fmtInfo1.valueMin.m_data + 2),
                 (Vector<float,_4> *)&texToFbo0Shader.m_outputType);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_410,pDVar5,DVar2,(Vec4 *)&multiTexShader.m_outputType,
             (Vec4 *)&texToFbo0Shader.m_outputType);
  FboTestUtil::DataTypes::~DataTypes(&local_428);
  local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_5e8);
  local_5f0 = texFmt1;
  DVar2 = glu::getSampler2DType(texFmt1);
  pDVar5 = FboTestUtil::DataTypes::operator<<(&local_5e8,DVar2);
  local_5f8[0] = fmtInfo0.lookupBias.m_data[2];
  local_5f8[1] = fmtInfo0.lookupBias.m_data[3];
  DVar2 = glu::getSampler2DType((TextureFormat)fmtInfo0.lookupBias.m_data._8_8_);
  pDVar5 = FboTestUtil::DataTypes::operator<<(pDVar5,DVar2);
  tcu::Vector<float,_4>::Vector(&local_608,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texToFbo1ShaderID,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_5d0,pDVar5,TYPE_FLOAT_VEC4,&local_608,
             (Vec4 *)&texToFbo1ShaderID);
  FboTestUtil::DataTypes::~DataTypes(&local_5e8);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  multiTexShaderID = (*pCVar6->_vptr_Context[0x75])(pCVar6,local_240);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  local_620 = (*pCVar6->_vptr_Context[0x75])(pCVar6,local_410);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  local_624 = (*pCVar6->_vptr_Context[0x75])(pCVar6,local_5d0);
  tcu::operator*((tcu *)&local_634,(Vector<float,_4> *)(fmtInfo0.valueMax.m_data + 2),0.5);
  tcu::operator*((tcu *)&local_644,(Vector<float,_4> *)(fmtInfo0.lookupScale.m_data + 2),0.5);
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_5d0,0,&local_634,&local_644);
  tcu::operator*((tcu *)&local_654,(Vector<float,_4> *)(fmtInfo1.valueMax.m_data + 2),0.5);
  tcu::operator*((tcu *)&fbo1,(Vector<float,_4> *)(fmtInfo1.lookupScale.m_data + 2),0.5);
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_5d0,1,&local_654,(Vec4 *)&fbo1);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_240,pCVar6,multiTexShaderID);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_410,pCVar6,local_620);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_5d0,pCVar6,local_624);
  for (transferFmt.format = 0; (int)transferFmt.format < 2;
      transferFmt.format = transferFmt.format + 1) {
    if (transferFmt.format == 0) {
      local_888 = &texFmt1;
    }
    else {
      local_888 = (TextureFormat *)(fmtInfo0.lookupBias.m_data + 2);
    }
    TStack_688 = *local_888;
    local_680 = glu::getTransferFormat(TStack_688);
    if (transferFmt.format == 0) {
      local_894 = *(deUint32 *)&(this->super_FboColorbufferCase).field_0x8c;
    }
    else {
      local_894 = this->m_tex1Fmt;
    }
    size._4_4_ = local_894;
    size._3_1_ = glu::isGLInternalColorFormatFilterable(local_894);
    if (transferFmt.format == 0) {
      local_8a0 = &this->m_tex0Size;
    }
    else {
      local_8a0 = &this->m_tex1Size;
    }
    fbo = (deUint32 *)local_8a0;
    if (transferFmt.format == 0) {
      local_8a8 = &tex0;
    }
    else {
      local_8a8 = &tex1;
    }
    tex = local_8a8;
    if (transferFmt.format == 0) {
      local_8b0 = (deUint32 *)&ndx;
    }
    else {
      local_8b0 = &transferFmt.dataType;
    }
    _format_1 = local_8b0;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,local_8a8)
    ;
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,_format_1)
    ;
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               *_format_1);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,size._3_1_ & 1 | 0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,size._3_1_ & 1 | 0x2600);
    dVar1 = size._4_4_;
    iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)fbo);
    iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)fbo);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               dVar1,iVar3,iVar4,0,local_680.format,local_680.dataType,(void *)0x0);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,*tex)
    ;
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,0xde1,*_format_1,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  }
  for (dataType = 0; (int)dataType < 2; dataType = dataType + 1) {
    texW = 0x1908;
    texH = 0x1401;
    tmpTex = 0x80;
    fbo_1 = 0x80;
    local_6c0 = 0;
    if (dataType == 0) {
      local_8d0 = &this->m_tex0Size;
      dVar1 = tex0;
    }
    else {
      local_8d0 = &this->m_tex1Size;
      dVar1 = tex1;
    }
    data.m_data.m_cap = (size_t)local_8d0;
    local_700 = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_6f8,&local_700,0x80,0x80,1);
    if (dataType == 0) {
      tcu::TextureLevel::getAccess(&local_728,(TextureLevel *)local_6f8);
      tcu::Vector<float,_4>::Vector(&local_738,0.0);
      tcu::Vector<float,_4>::Vector(&local_748,1.0);
      tcu::fillWithComponentGradients(&local_728,&local_738,&local_748);
    }
    else {
      tcu::TextureLevel::getAccess(&local_770,(TextureLevel *)local_6f8);
      tcu::Vector<float,_4>::Vector(&local_780,0.2,0.7,0.1,1.0);
      tcu::Vector<float,_4>::Vector(&local_790,0.7,0.1,0.5,0.8);
      tcu::fillWithGrid(&local_770,8,&local_780,&local_790);
    }
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_6c0
              );
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               local_6c0);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2601);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2601);
    tcu::TextureLevel::getAccess(&local_7b8,(TextureLevel *)local_6f8);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_7b8);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               0x1908,0x80,0x80,0,0x1908,0x1401,data_00);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,dVar1
              );
    iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)data.m_data.m_cap);
    iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)data.m_data.m_cap);
    sglr::ContextWrapper::glViewport
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,iVar3,
               iVar4);
    pCVar6 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    if (dataType == 0) {
      local_90c = multiTexShaderID;
    }
    else {
      local_90c = local_620;
    }
    tcu::Vector<float,_3>::Vector(&local_7c4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_7d0,1.0,1.0,0.0);
    sglr::drawQuad(pCVar6,local_90c,&local_7c4,&local_7d0);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_6f8);
  }
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  sglr::ContextWrapper::glViewport(this_00,0,0,iVar3,iVar4);
  sglr::ContextWrapper::glActiveTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c0);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,ndx);
  sglr::ContextWrapper::glActiveTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c1);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
             transferFmt.dataType);
  pCVar6 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  dVar1 = local_624;
  tcu::Vector<float,_3>::Vector(&local_7dc,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_7e8,1.0,1.0,0.0);
  sglr::drawQuad(pCVar6,dVar1,&local_7dc,&local_7e8);
  iVar3 = sglr::ContextWrapper::getWidth
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  iVar4 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar3,iVar4);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_5d0);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_410);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_240);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		texFmt0			= glu::mapGLInternalFormat(m_tex0Fmt);
		tcu::TextureFormat		texFmt1			= glu::mapGLInternalFormat(m_tex1Fmt);
		tcu::TextureFormatInfo	fmtInfo0		= tcu::getTextureFormatInfo(texFmt0);
		tcu::TextureFormatInfo	fmtInfo1		= tcu::getTextureFormatInfo(texFmt1);

		Texture2DShader			texToFbo0Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt0), fmtInfo0.valueMax-fmtInfo0.valueMin, fmtInfo0.valueMin);
		Texture2DShader			texToFbo1Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt1), fmtInfo1.valueMax-fmtInfo1.valueMin, fmtInfo1.valueMin);
		Texture2DShader			multiTexShader	(DataTypes() << glu::getSampler2DType(texFmt0) << glu::getSampler2DType(texFmt1), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFbo0ShaderID = getCurrentContext()->createProgram(&texToFbo0Shader);
		deUint32				texToFbo1ShaderID = getCurrentContext()->createProgram(&texToFbo1Shader);
		deUint32				multiTexShaderID  = getCurrentContext()->createProgram(&multiTexShader);

		// Setup shaders
		multiTexShader.setTexScaleBias(0, fmtInfo0.lookupScale * 0.5f, fmtInfo0.lookupBias * 0.5f);
		multiTexShader.setTexScaleBias(1, fmtInfo1.lookupScale * 0.5f, fmtInfo1.lookupBias * 0.5f);
		texToFbo0Shader.setUniforms(*getCurrentContext(), texToFbo0ShaderID);
		texToFbo1Shader.setUniforms(*getCurrentContext(), texToFbo1ShaderID);
		multiTexShader.setUniforms (*getCurrentContext(), multiTexShaderID);

		// Framebuffers.
		deUint32				fbo0, fbo1;
		deUint32				tex0, tex1;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(ndx ? texFmt1 : texFmt0);
			deUint32				format			= ndx ? m_tex1Fmt : m_tex0Fmt;
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(format);
			const IVec2&			size			= ndx ? m_tex1Size : m_tex0Size;
			deUint32&				fbo				= ndx ? fbo1 : fbo0;
			deUint32&				tex				= ndx ? tex1 : tex0;

			glGenFramebuffers(1, &fbo);
			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D, tex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// Render textures to both framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			deUint32			fbo			= ndx ? fbo1 : fbo0;
			const IVec2&		viewport	= ndx ? m_tex1Size : m_tex0Size;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			if (ndx == 0)
				tcu::fillWithComponentGradients(data.getAccess(), Vec4(0.0f), Vec4(1.0f));
			else
				tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), ndx ? texToFbo1ShaderID : texToFbo0ShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Render to framebuffer.
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		glViewport(0, 0, getWidth(), getHeight());
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, tex0);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, tex1);
		sglr::drawQuad(*getCurrentContext(), multiTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}